

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_removeVariablesFromConnections_Test::TestBody
          (Connection_removeVariablesFromConnections_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_4b8 [8];
  Message local_4b0 [8];
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_478 [8];
  Message local_470 [8];
  undefined1 local_468 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_438 [8];
  Message local_430 [8];
  undefined1 local_428 [8];
  AssertionResult gtest_ar_2;
  allocator<char> local_3f1;
  string local_3f0 [32];
  AssertHelper local_3d0 [8];
  Message local_3c8 [8];
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_390 [8];
  Message local_388 [8];
  undefined1 local_380 [8];
  AssertionResult gtest_ar;
  string a;
  PrinterPtr printer;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [32];
  undefined1 local_188 [8];
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1_2;
  VariablePtr v1_1;
  ComponentPtr comp4;
  ComponentPtr comp3;
  ComponentPtr comp2;
  ComponentPtr comp1;
  ModelPtr m;
  undefined1 local_e0 [8];
  string e5;
  undefined1 local_b8 [8];
  string e4;
  undefined1 local_90 [8];
  string e3;
  undefined1 local_68 [8];
  string e2;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e1;
  Connection_removeVariablesFromConnections_Test *this_local;
  
  e1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component1\">\n    <variable name=\"variable1_1\"/>\n    <variable name=\"variable1_2\"/>\n  </component>\n  <component name=\"component2\">\n    <variable name=\"variable2\"/>\n  </component>\n  <component name=\"component3\">\n    <variable name=\"variable3\"/>\n  </component>\n  <component name=\"component4\">\n    <variable name=\"variable4\"/>\n  </component>\n  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n  </connection>\n  <connection component_1=\"component1\" component_2=\"component3\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n  </connection>\n  <connection component_1=\"component1\" component_2=\"component4\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n  </connection>\n  <connection component_1=\"component2\" component_2=\"component3\">\n    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n  </connection>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component1\">\n    <variable name=\"variable1_1\"/>\n    <variable name=\"variable1_2\"/>\n  </component>\n  <component name=\"component2\">\n    <variable name=\"variable2\"/>\n  </component>\n  <component name=\"component3\">\n    <variable name=\"variable3\"/>\n  </component>\n  <component name=\"component4\"/>\n  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n  </connection>\n  <connection component_1=\"component1\" component_2=\"component3\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n  </connection>\n  <connection component_1=\"component1\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n  </connection>\n  <connection component_1=\"component2\" component_2=\"component3\">\n    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n  </connection>\n</model>\n"
             ,(allocator<char> *)(e3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(e3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component1\">\n    <variable name=\"variable1_1\"/>\n    <variable name=\"variable1_2\"/>\n  </component>\n  <component name=\"component2\">\n    <variable name=\"variable2\"/>\n  </component>\n  <component name=\"component3\"/>\n  <component name=\"component4\"/>\n  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n  </connection>\n  <connection component_1=\"component1\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n  </connection>\n  <connection component_1=\"component2\">\n    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n  </connection>\n</model>\n"
             ,(allocator<char> *)(e4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(e4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component1\">\n    <variable name=\"variable1_1\"/>\n    <variable name=\"variable1_2\"/>\n  </component>\n  <component name=\"component2\"/>\n  <component name=\"component3\"/>\n  <component name=\"component4\"/>\n  <connection component_1=\"component1\" id=\"conId\">\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n  </connection>\n</model>\n"
             ,(allocator<char> *)(e5.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(e5.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component1\"/>\n  <component name=\"component2\"/>\n  <component name=\"component3\"/>\n  <component name=\"component4\"/>\n</model>\n"
             ,(allocator<char> *)
              ((long)&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp2.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"component1",&local_1a9);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp3.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"component2",&local_1d1);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp4.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"component3",&local_1f9);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1_1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"component4",&local_221);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v1_2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"variable1_1",&local_249);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"variable1_2",&local_271);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"variable2",&local_299);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"variable3",&local_2c1);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"variable4",&local_2e9);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp2.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp2.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp3.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp4.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1_1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v1_2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"conId",&local_311);
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             local_310);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v1_2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)
             &v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v1_2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"v11v4Id",
             (allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setEquivalenceMappingId
            ((shared_ptr *)
             &v1_2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_188,local_338);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)
             &v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Printer::create();
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar.message_,SUB81(peVar5,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_380,"e1","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(local_388);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              (local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x3ca,pcVar6);
    testing::internal::AssertHelper::operator=(local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(local_390);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1_1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Component::removeVariable((shared_ptr *)peVar2);
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_1.message_,SUB81(peVar5,0));
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_3c0,"e2","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(local_3c8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              (local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x3ce,pcVar6);
    testing::internal::AssertHelper::operator=(local_3d0,local_3c8);
    testing::internal::AssertHelper::~AssertHelper(local_3d0);
    testing::Message::~Message(local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp4.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"variable3",&local_3f1);
  libcellml::Component::removeVariable((string *)peVar2);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_2.message_,SUB81(peVar5,0));
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_428,"e3","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(local_430);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              (local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x3d2,pcVar6);
    testing::internal::AssertHelper::operator=(local_438,local_430);
    testing::internal::AssertHelper::~AssertHelper(local_438);
    testing::Message::~Message(local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp3.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::removeVariable((shared_ptr *)peVar2);
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_3.message_,SUB81(peVar5,0));
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_3.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_468,"e4","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(local_470);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              (local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x3d6,pcVar6);
    testing::internal::AssertHelper::operator=(local_478,local_470);
    testing::internal::AssertHelper::~AssertHelper(local_478);
    testing::Message::~Message(local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &comp2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  libcellml::Component::removeAllVariables();
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_4.message_,SUB81(peVar5,0));
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_4.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_4a8,"e5","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(local_4b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              (local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x3da,pcVar6);
    testing::internal::AssertHelper::operator=(local_4b8,local_4b0);
    testing::internal::AssertHelper::~AssertHelper(local_4b8);
    testing::Message::~Message(local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_188);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v1_2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1_1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &comp4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &comp3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &comp2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Connection, removeVariablesFromConnections)
{
    // Initial model
    const std::string e1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\">\n"
        "    <variable name=\"variable3\"/>\n"
        "  </component>\n"
        "  <component name=\"component4\">\n"
        "    <variable name=\"variable4\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component4\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component2\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove variable4
    const std::string e2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\">\n"
        "    <variable name=\"variable3\"/>\n"
        "  </component>\n"
        "  <component name=\"component4\"/>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component2\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove variable3
    const std::string e3 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\"/>\n"
        "  <component name=\"component4\"/>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component2\">\n"
        "    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove variable2
    const std::string e4 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\"/>\n"
        "  <component name=\"component3\"/>\n"
        "  <component name=\"component4\"/>\n"
        "  <connection component_1=\"component1\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove all variables from component1 (variable1_1 and variable1_2)
    const std::string e5 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\"/>\n"
        "  <component name=\"component2\"/>\n"
        "  <component name=\"component3\"/>\n"
        "  <component name=\"component4\"/>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::ComponentPtr comp3 = libcellml::Component::create();
    libcellml::ComponentPtr comp4 = libcellml::Component::create();
    libcellml::VariablePtr v1_1 = libcellml::Variable::create();
    libcellml::VariablePtr v1_2 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();
    comp1->setName("component1");
    comp2->setName("component2");
    comp3->setName("component3");
    comp4->setName("component4");
    v1_1->setName("variable1_1");
    v1_2->setName("variable1_2");
    v2->setName("variable2");
    v3->setName("variable3");
    v4->setName("variable4");

    comp1->addVariable(v1_1);
    comp1->addVariable(v1_2);
    comp2->addVariable(v2);
    comp3->addVariable(v3);
    comp4->addVariable(v4);
    m->addComponent(comp1);
    m->addComponent(comp2);
    m->addComponent(comp3);
    m->addComponent(comp4);
    libcellml::Variable::addEquivalence(v1_1, v2);
    libcellml::Variable::addEquivalence(v1_2, v2);
    libcellml::Variable::setEquivalenceConnectionId(v1_2, v2, "conId");
    libcellml::Variable::addEquivalence(v1_1, v3);
    libcellml::Variable::addEquivalence(v1_1, v4);
    libcellml::Variable::setEquivalenceMappingId(v1_1, v4, "v11v4Id");
    libcellml::Variable::addEquivalence(v2, v3);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e1, a);

    comp4->removeVariable(v4);
    a = printer->printModel(m);
    EXPECT_EQ(e2, a);

    comp3->removeVariable("variable3");
    a = printer->printModel(m);
    EXPECT_EQ(e3, a);

    comp2->removeVariable(v2);
    a = printer->printModel(m);
    EXPECT_EQ(e4, a);

    comp1->removeAllVariables();
    a = printer->printModel(m);
    EXPECT_EQ(e5, a);
}